

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::clear(PathTracer *this)

{
  BVHNode *pBVar1;
  BVHAccel *in_RDI;
  HDRImageBuffer *unaff_retaddr;
  BVHAccel *w;
  
  if (*(int *)&(in_RDI->super_Aggregate).super_Primitive._vptr_Primitive == 1) {
    pBVar1 = in_RDI[2].root;
    w = in_RDI;
    if (pBVar1 != (BVHNode *)0x0) {
      StaticScene::BVHAccel::~BVHAccel(in_RDI);
      operator_delete(pBVar1);
    }
    in_RDI[2].root = (BVHNode *)0x0;
    (in_RDI->super_Aggregate).primitives.
    super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->super_Aggregate).primitives.
    super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
    ::pop((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
           *)0x25605b);
    HDRImageBuffer::resize(unaff_retaddr,(size_t)w,(size_t)in_RDI);
    ImageBuffer::resize((ImageBuffer *)unaff_retaddr,(size_t)w,(size_t)in_RDI);
    *(undefined4 *)&(in_RDI->super_Aggregate).super_Primitive._vptr_Primitive = 0;
  }
  return;
}

Assistant:

void PathTracer::clear() {
  if (state != READY) return;
  delete bvh;
  bvh = NULL;
  scene = NULL;
  camera = NULL;
  selectionHistory.pop();
  sampleBuffer.resize(0, 0);
  frameBuffer.resize(0, 0);
  state = INIT;
}